

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O3

ReaderInitializeType
duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::InitializeReader
          (MultiFileReaderData *reader_data,MultiFileBindData *bind_data,
          vector<duckdb::ColumnIndex,_true> *global_column_ids,
          optional_ptr<duckdb::TableFilterSet,_true> table_filters,ClientContext *context,
          optional_idx file_idx,optional_ptr<duckdb::MultiFileReaderGlobalState,_true> reader_state)

{
  ReaderInitializeType RVar1;
  type pBVar2;
  pointer pMVar3;
  vector<duckdb::MultiFileColumnDefinition,_true> *pvVar4;
  
  pBVar2 = shared_ptr<duckdb::BaseFileReader,_true>::operator*(&reader_data->reader);
  (pBVar2->file_list_idx).index = file_idx.index;
  pvVar4 = &(bind_data->reader_bind).schema;
  if ((bind_data->reader_bind).schema.
      super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
      .
      super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (bind_data->reader_bind).schema.
      super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
      .
      super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar4 = &bind_data->columns;
  }
  pMVar3 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>::
           operator->(&bind_data->multi_file_reader);
  RVar1 = (*pMVar3->_vptr_MultiFileReader[0xe])
                    (pMVar3,reader_data,bind_data,pvVar4,global_column_ids,table_filters.ptr,context
                     ,reader_state.ptr);
  return RVar1;
}

Assistant:

static ReaderInitializeType InitializeReader(MultiFileReaderData &reader_data, const MultiFileBindData &bind_data,
	                                             const vector<ColumnIndex> &global_column_ids,
	                                             optional_ptr<TableFilterSet> table_filters, ClientContext &context,
	                                             optional_idx file_idx,
	                                             optional_ptr<MultiFileReaderGlobalState> reader_state) {
		auto &reader = *reader_data.reader;
		// Mark the file in the file list we are scanning here
		reader.file_list_idx = file_idx;

		// 'reader_bind.schema' could be set explicitly by:
		// 1. The MultiFileReader::Bind call
		// 2. The 'schema' parquet option
		auto &global_columns = bind_data.reader_bind.schema.empty() ? bind_data.columns : bind_data.reader_bind.schema;
		return bind_data.multi_file_reader->InitializeReader(reader_data, bind_data, global_columns, global_column_ids,
		                                                     table_filters, context, reader_state);
	}